

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.h
# Opt level: O3

void __thiscall cfd::js::api::json::ConvertAesRequest::ConvertAesRequest(ConvertAesRequest *this)

{
  _Rb_tree_header *p_Var1;
  
  (this->super_JsonClassBase<cfd::js::api::json::ConvertAesRequest>)._vptr_JsonClassBase =
       (_func_int **)&PTR__ConvertAesRequest_00a7ab48;
  p_Var1 = &(this->ignore_items)._M_t._M_impl.super__Rb_tree_header;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->is_encrypt_ = true;
  (this->mode_)._M_dataplus._M_p = (pointer)&(this->mode_).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->mode_,"cbc","");
  (this->key_)._M_dataplus._M_p = (pointer)&(this->key_).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->key_,"");
  (this->iv_)._M_dataplus._M_p = (pointer)&(this->iv_).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->iv_,"");
  (this->data_)._M_dataplus._M_p = (pointer)&(this->data_).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->data_,"");
  CollectFieldName();
  return;
}

Assistant:

ConvertAesRequest() {
    CollectFieldName();
  }